

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O0

size_t len_to_mask(size_t len)

{
  size_t len_local;
  
  switch(len) {
  case 0x10:
    len_local = 0xf0;
    break;
  default:
    len_local = 0;
    break;
  case 0x14:
    len_local = 0xf8;
    break;
  case 0x18:
    len_local = 0xfc;
    break;
  case 0x1c:
    len_local = 0xfe;
    break;
  case 0x20:
    len_local = 0xff;
    break;
  case 0x24:
    len_local = 0x80ff;
    break;
  case 0x28:
    len_local = 0xc0ff;
  }
  return len_local;
}

Assistant:

static size_t len_to_mask(size_t len)
{
    switch (len) {
    case BIP39_ENTROPY_LEN_128: return 0xf0;
    case BIP39_ENTROPY_LEN_160: return 0xf8;
    case BIP39_ENTROPY_LEN_192: return 0xfc;
    case BIP39_ENTROPY_LEN_224: return 0xfe;
    case BIP39_ENTROPY_LEN_256: return 0xff;
    case BIP39_ENTROPY_LEN_288: return 0x80ff;
    case BIP39_ENTROPY_LEN_320: return 0xC0ff;
    }
    return 0;
}